

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__linear_to_rgbe(uchar *rgbe,float *linear)

{
  uchar uVar1;
  uchar uVar2;
  float fVar3;
  char local_2c [4];
  float local_28;
  float local_24;
  
  local_28 = *linear;
  fVar3 = linear[1];
  if (linear[1] <= linear[2]) {
    fVar3 = linear[2];
  }
  local_24 = local_28;
  if (local_28 <= fVar3) {
    local_24 = fVar3;
  }
  if (1e-32 <= local_24) {
    fVar3 = frexpf(local_24,(int *)local_2c);
    local_24 = (fVar3 * 256.0) / local_24;
    *rgbe = (uchar)(int)(local_28 * local_24);
    rgbe[1] = (uchar)(int)(linear[1] * local_24);
    uVar2 = (uchar)(int)(local_24 * linear[2]);
    uVar1 = local_2c[0] + 0x80;
  }
  else {
    rgbe[0] = '\0';
    rgbe[1] = '\0';
    uVar1 = '\0';
    uVar2 = '\0';
  }
  rgbe[3] = uVar1;
  rgbe[2] = uVar2;
  return;
}

Assistant:

void stbiw__linear_to_rgbe(unsigned char *rgbe, float *linear)
{
   int exponent;
   float maxcomp = stbiw__max(linear[0], stbiw__max(linear[1], linear[2]));

   if (maxcomp < 1e-32) {
      rgbe[0] = rgbe[1] = rgbe[2] = rgbe[3] = 0;
   } else {
      float normalize = (float) frexp(maxcomp, &exponent) * 256.0f/maxcomp;

      rgbe[0] = (unsigned char)(linear[0] * normalize);
      rgbe[1] = (unsigned char)(linear[1] * normalize);
      rgbe[2] = (unsigned char)(linear[2] * normalize);
      rgbe[3] = (unsigned char)(exponent + 128);
   }
}